

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_paged_audio_buffer__data_source_on_get_length
                    (ma_data_source *pDataSource,ma_uint64 *pLength)

{
  long lVar1;
  ma_result mVar2;
  undefined8 *puVar3;
  
  mVar2 = MA_INVALID_ARGS;
  if (pLength != (ma_uint64 *)0x0) {
    lVar1 = *(long *)((long)pDataSource + 0x48);
    *pLength = 0;
    if (lVar1 != 0) {
      mVar2 = MA_SUCCESS;
      for (puVar3 = *(undefined8 **)(lVar1 + 8); puVar3 != (undefined8 *)0x0;
          puVar3 = (undefined8 *)*puVar3) {
        *pLength = *pLength + puVar3[1];
      }
    }
  }
  return mVar2;
}

Assistant:

static ma_result ma_paged_audio_buffer__data_source_on_get_length(ma_data_source* pDataSource, ma_uint64* pLength)
{
    return ma_paged_audio_buffer_get_length_in_pcm_frames((ma_paged_audio_buffer*)pDataSource, pLength);
}